

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O1

void __thiscall Fl_Menu_::clear(Fl_Menu_ *this)

{
  void *__ptr;
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (this->alloc != '\0') {
    if (this->alloc != '\x01') {
      if (this->menu_ == (Fl_Menu_Item *)0x0) {
        iVar1 = 0;
      }
      else {
        iVar1 = Fl_Menu_Item::size(this->menu_);
      }
      if (iVar1 != 0) {
        lVar2 = (long)iVar1;
        lVar3 = lVar2 * 0x38;
        do {
          __ptr = *(void **)((long)&this->menu_[-1].text + lVar3);
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          lVar2 = lVar2 + -1;
          lVar3 = lVar3 + -0x38;
        } while (lVar2 != 0);
      }
    }
    if (fl_menu_array_owner == this) {
      fl_menu_array_owner = (Fl_Menu_ *)0x0;
    }
    else if (this->menu_ != (Fl_Menu_Item *)0x0) {
      operator_delete__(this->menu_);
    }
    this->menu_ = (Fl_Menu_Item *)0x0;
    this->value_ = (Fl_Menu_Item *)0x0;
    this->alloc = '\0';
  }
  return;
}

Assistant:

void Fl_Menu_::clear() {
  if (alloc) {
    if (alloc>1) for (int i = size(); i--;)
      if (menu_[i].text) free((void*)menu_[i].text);
    if (this == fl_menu_array_owner)
      fl_menu_array_owner = 0;
    else
      delete[] menu_;
    menu_ = 0;
    value_ = 0;
    alloc = 0;
  }
}